

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unesctrn.cpp
# Opt level: O0

void __thiscall
icu_63::UnescapeTransliterator::handleTransliterate
          (UnescapeTransliterator *this,Replaceable *text,UTransPosition *pos,UBool isIncremental)

{
  UChar UVar1;
  UChar UVar2;
  UChar UVar3;
  bool bVar4;
  char16_t cVar5;
  uint ch_00;
  int iVar6;
  int32_t iVar7;
  uint uVar8;
  char radix_00;
  int iVar9;
  undefined1 local_a8 [8];
  UnicodeString str;
  UChar c_1;
  int32_t digit;
  UChar32 ch;
  int32_t digitCount;
  UChar32 u;
  UChar c;
  UBool match;
  int32_t s;
  int32_t maxDigits;
  int32_t minDigits;
  int8_t radix;
  int32_t suffixLen;
  int32_t prefixLen;
  int32_t ipat;
  int32_t j;
  int32_t i;
  int32_t limit;
  int32_t start;
  UBool isIncremental_local;
  UTransPosition *pos_local;
  Replaceable *text_local;
  UnescapeTransliterator *this_local;
  
  i = pos->start;
  j = pos->limit;
  do {
    if (j <= i) {
LAB_003041d7:
      pos->contextLimit = (j - pos->limit) + pos->contextLimit;
      pos->limit = j;
      pos->start = i;
      return;
    }
    suffixLen = 0;
    while (this->spec[suffixLen] != L'\xffff') {
      uVar8 = (uint)(ushort)this->spec[suffixLen];
      UVar1 = this->spec[suffixLen + 1];
      radix_00 = (char)this->spec[suffixLen + 2];
      UVar2 = this->spec[suffixLen + 3];
      iVar9 = suffixLen + 5;
      UVar3 = this->spec[suffixLen + 4];
      u = i;
      bVar4 = true;
      for (ipat = 0; ipat < (int)uVar8; ipat = ipat + 1) {
        if ((j <= u) && (0 < ipat)) {
          if (isIncremental != '\0') goto LAB_003041d7;
          bVar4 = false;
          break;
        }
        cVar5 = Replaceable::charAt(text,u);
        if (cVar5 != this->spec[iVar9 + ipat]) {
          bVar4 = false;
          u = u + 1;
          break;
        }
        u = u + 1;
      }
      if (bVar4) {
        ch = 0;
        digit = 0;
        do {
          if (j <= u) {
            if ((i < u) && (isIncremental != '\0')) goto LAB_003041d7;
            break;
          }
          ch_00 = Replaceable::char32At(text,u);
          str.fUnion._52_4_ = u_digit_63(ch_00,radix_00);
          if ((int)str.fUnion._52_4_ < 0) break;
          iVar6 = 2;
          if (ch_00 < 0x10000) {
            iVar6 = 1;
          }
          u = iVar6 + u;
          ch = ch * radix_00 + str.fUnion._52_4_;
          digit = digit + 1;
        } while (digit != (uint)(ushort)UVar3);
        bVar4 = (int)(uint)(ushort)UVar2 <= digit;
        if (bVar4) {
          for (ipat = 0; ipat < (int)(uint)(ushort)UVar1; ipat = ipat + 1) {
            if (j <= u) {
              if ((i < u) && (isIncremental != '\0')) goto LAB_003041d7;
              bVar4 = false;
              break;
            }
            str.fUnion.fStackFields.fBuffer[0x18] = Replaceable::charAt(text,u);
            if (str.fUnion.fStackFields.fBuffer[0x18] != this->spec[(int)(iVar9 + uVar8 + ipat)]) {
              bVar4 = false;
              u = u + 1;
              break;
            }
            u = u + 1;
          }
          if (bVar4) {
            icu_63::UnicodeString::UnicodeString((UnicodeString *)local_a8,ch);
            (*(text->super_UObject)._vptr_UObject[4])
                      (text,(ulong)(uint)i,(ulong)(uint)u,(UnicodeString *)local_a8);
            iVar7 = icu_63::UnicodeString::length((UnicodeString *)local_a8);
            j = j - ((u - i) - iVar7);
            icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_a8);
            break;
          }
        }
      }
      suffixLen = uVar8 + (ushort)UVar1 + iVar9;
    }
    if (i < j) {
      uVar8 = Replaceable::char32At(text,i);
      iVar9 = 2;
      if (uVar8 < 0x10000) {
        iVar9 = 1;
      }
      i = iVar9 + i;
    }
  } while( true );
}

Assistant:

void UnescapeTransliterator::handleTransliterate(Replaceable& text, UTransPosition& pos,
                                                 UBool isIncremental) const {
    int32_t start = pos.start;
    int32_t limit = pos.limit;
    int32_t i, j, ipat;

    while (start < limit) {
        // Loop over the forms in spec[].  Exit this loop when we
        // match one of the specs.  Exit the outer loop if a
        // partial match is detected and isIncremental is true.
        for (j=0, ipat=0; spec[ipat] != END; ++j) {

            // Read the header
            int32_t prefixLen = spec[ipat++];
            int32_t suffixLen = spec[ipat++];
            int8_t  radix     = (int8_t) spec[ipat++];
            int32_t minDigits = spec[ipat++];
            int32_t maxDigits = spec[ipat++];

            // s is a copy of start that is advanced over the
            // characters as we parse them.
            int32_t s = start;
            UBool match = TRUE;

            for (i=0; i<prefixLen; ++i) {
                if (s >= limit) {
                    if (i > 0) {
                        // We've already matched a character.  This is
                        // a partial match, so we return if in
                        // incremental mode.  In non-incremental mode,
                        // go to the next spec.
                        if (isIncremental) {
                            goto exit;
                        }
                        match = FALSE;
                        break;
                    }
                }
                UChar c = text.charAt(s++);
                if (c != spec[ipat + i]) {
                    match = FALSE;
                    break;
                }
            }

            if (match) {
                UChar32 u = 0;
                int32_t digitCount = 0;
                for (;;) {
                    if (s >= limit) {
                        // Check for partial match in incremental mode.
                        if (s > start && isIncremental) {
                            goto exit;
                        }
                        break;
                    }
                    UChar32 ch = text.char32At(s);
                    int32_t digit = u_digit(ch, radix);
                    if (digit < 0) {
                        break;
                    }
                    s += U16_LENGTH(ch);
                    u = (u * radix) + digit;
                    if (++digitCount == maxDigits) {
                        break;
                    }
                }

                match = (digitCount >= minDigits);

                if (match) {
                    for (i=0; i<suffixLen; ++i) {
                        if (s >= limit) {
                            // Check for partial match in incremental mode.
                            if (s > start && isIncremental) {
                                goto exit;
                            }
                            match = FALSE;
                            break;
                        }
                        UChar c = text.charAt(s++);
                        if (c != spec[ipat + prefixLen + i]) {
                            match = FALSE;
                            break;
                        }
                    }

                    if (match) {
                        // At this point, we have a match
                        UnicodeString str(u);
                        text.handleReplaceBetween(start, s, str);
                        limit -= s - start - str.length();
                        // The following break statement leaves the
                        // loop that is traversing the forms in
                        // spec[].  We then parse the next input
                        // character.
                        break;
                    }
                }
            }

            ipat += prefixLen + suffixLen;
        }

        if (start < limit) {
            start += U16_LENGTH(text.char32At(start));
        }
    }

  exit:
    pos.contextLimit += limit - pos.limit;
    pos.limit = limit;
    pos.start = start;
}